

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void add_one_insn(dmr_C *C,entrypoint *ep,instruction *insn)

{
  basic_block *bb_00;
  int iVar1;
  basic_block *bb;
  instruction *insn_local;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  bb_00 = ep->active;
  iVar1 = dmrC_bb_reachable(bb_00);
  if (iVar1 != 0) {
    insn->bb = bb_00;
    dmrC_add_instruction(C,&bb_00->insns,insn);
  }
  return;
}

Assistant:

static void add_one_insn(struct dmr_C *C, struct entrypoint *ep, struct instruction *insn)
{
	struct basic_block *bb = ep->active;    

	if (dmrC_bb_reachable(bb)) {
		insn->bb = bb;
		dmrC_add_instruction(C, &bb->insns, insn);
	}
}